

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O3

void __thiscall CTxMemPool::AddUnbroadcastTx(CTxMemPool *this,uint256 *txid)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  unique_lock<std::recursive_mutex> local_50;
  GenTxid local_39;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_device = &(this->cs).super_recursive_mutex;
  local_50._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_50);
  local_39.m_is_wtxid = false;
  local_39.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(txid->super_base_blob<256U>).m_data._M_elems;
  local_39.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 8);
  local_39.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_39.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x18);
  bVar1 = exists(this,&local_39);
  if (bVar1) {
    std::
    _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
    _M_insert_unique<uint256_const&>
              ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                *)&this->m_unbroadcast_txids,txid);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddUnbroadcastTx(const uint256& txid)
    {
        LOCK(cs);
        // Sanity check the transaction is in the mempool & insert into
        // unbroadcast set.
        if (exists(GenTxid::Txid(txid))) m_unbroadcast_txids.insert(txid);
    }